

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O0

void __thiscall
trackerboy::apu::Hardware::
runAndMixChannel<trackerboy::apu::WaveChannel,(trackerboy::apu::MixMode)2>
          (Hardware *this,size_t index,WaveChannel *ch,Mixer *mixer,uint32_t cycletime,
          uint32_t cycles)

{
  uint32_t uVar1;
  Timer *this_00;
  uint32_t local_64;
  uint32_t period;
  uint32_t clocks;
  Timer *timer;
  anon_class_32_4_a2a720fc mixChanges;
  value_type_conflict2 *last;
  uint32_t cycles_local;
  uint32_t cycletime_local;
  Mixer *mixer_local;
  WaveChannel *ch_local;
  size_t index_local;
  Hardware *this_local;
  
  last._0_4_ = cycles;
  last._4_4_ = cycletime;
  _cycles_local = mixer;
  mixer_local = (Mixer *)ch;
  ch_local = (WaveChannel *)index;
  index_local = (size_t)this;
  mixChanges.ch =
       (WaveChannel *)std::array<unsigned_char,_4UL>::operator[](&this->mLastOutputs,index);
  timer = (Timer *)mixer_local;
  mixChanges.last = (value_type_conflict2 *)_cycles_local;
  mixChanges.mixer = (Mixer *)((long)&last + 4);
  mixChanges.cycletime = (uint32_t *)mixChanges.ch;
  this_00 = Channel::timer((Channel *)mixer_local);
  runAndMixChannel<trackerboy::apu::WaveChannel,_(trackerboy::apu::MixMode)2>::
  anon_class_32_4_a2a720fc::operator()((anon_class_32_4_a2a720fc *)&timer);
  uVar1 = Timer::counter(this_00);
  last._4_4_ = uVar1 + last._4_4_;
  local_64 = Timer::fastforward(this_00,(uint32_t)last);
  uVar1 = Timer::period(this_00);
  while (local_64 != 0) {
    WaveChannel::clock((WaveChannel *)mixer_local);
    local_64 = local_64 - 1;
    runAndMixChannel<trackerboy::apu::WaveChannel,_(trackerboy::apu::MixMode)2>::
    anon_class_32_4_a2a720fc::operator()((anon_class_32_4_a2a720fc *)&timer);
    last._4_4_ = uVar1 + last._4_4_;
  }
  return;
}

Assistant:

void Hardware::runAndMixChannel(size_t index, Channel &ch, Mixer &mixer, uint32_t cycletime, uint32_t cycles) noexcept {
    static_assert(mode != MixMode::mute, "cannot mix a muted mode");

    auto &last = mLastOutputs[index];

    auto mixChanges = [&]() {
        // mix any change in output
        if (auto out = ch.output(); out != last) {
            mixer.mixfast<mode>(out - last, cycletime);
            last = out;
        }
    };


    auto &timer = ch.timer();

    mixChanges();
    cycletime += timer.counter();

    // determine the number of clocks we are stepping
    auto clocks = timer.fastforward(cycles);
    auto const period = timer.period();

    // iterate each clock and mix any change in output
    while (clocks) {
        ch.clock();
        --clocks;
        mixChanges();
        cycletime += period;
    }

}